

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O1

void ndiSerialClose(int serial_port)

{
  termios *__termios_p;
  long lVar1;
  
  __termios_p = ndi_save_termios;
  lVar1 = 0;
  do {
    if (*(int *)((long)ndi_open_handles + lVar1) != -1 &&
        *(int *)((long)ndi_open_handles + lVar1) == serial_port) {
      tcsetattr(serial_port,0,(termios *)__termios_p);
      *(undefined4 *)((long)ndi_open_handles + lVar1) = 0xffffffff;
      break;
    }
    __termios_p = (termios *)((termios *)__termios_p + 1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x10);
  fcntl(serial_port,6,&ndiSerialClose::fu);
  close(serial_port);
  return;
}

Assistant:

ndicapiExport void ndiSerialClose(int serial_port)
{
  static struct flock fu = { F_UNLCK, 0, 0, 0 }; /* for file unlocking */
  int i;

  /* restore the comm port state to from before it was opened */
  for (i = 0; i < NDI_MAX_SAVE_STATE; i++)
  {
    if (ndi_open_handles[i] == serial_port && ndi_open_handles[i] != -1)
    {
      tcsetattr(serial_port, TCSANOW, &ndi_save_termios[i]);
      ndi_open_handles[i] = -1;
      break;
    }
  }

  /* release our lock on the serial port */
  fcntl(serial_port, F_SETLK, &fu);

  close(serial_port);
}